

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O1

char * helics::actionMessageType(action_t action)

{
  size_t sVar1;
  char *pcVar2;
  action_t in_EDI;
  action_t local_1c;
  
  local_1c = in_EDI;
  sVar1 = frozen::bits::pmh_tables<128ul,frozen::elsa<helics::action_message_def::action_t>>::
          lookup<helics::action_message_def::action_t,frozen::elsa<helics::action_message_def::action_t>>
                    ((pmh_tables<128ul,frozen::elsa<helics::action_message_def::action_t>> *)
                     (actionStrings + 0x908),&local_1c,
                     (elsa<helics::action_message_def::action_t> *)(actionStrings + 0x1110));
  if (sVar1 * 0x18 == 0x900 || *(action_t *)(actionStrings + sVar1 * 0x18 + 8) != local_1c) {
    pcVar2 = "unknown";
  }
  else {
    pcVar2 = *(char **)(actionStrings + sVar1 * 0x18 + 0x18);
  }
  return pcVar2;
}

Assistant:

const char* actionMessageType(action_message_def::action_t action)
{
    const auto* res = actionStrings.find(action);
    return (res != actionStrings.end()) ? res->second.data() : static_cast<const char*>(unknownStr);
}